

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,string *name,
                   vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                   double value)

{
  reference ppOVar1;
  undefined8 uVar2;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_RDX;
  HighsLogOptions *in_RDI;
  HighsLogOptions *in_XMM0_Qa;
  HighsOptionType type;
  OptionStatus status;
  HighsInt index;
  OptionRecordDouble *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  HighsOptionType HVar3;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  OptionStatus local_4;
  
  local_4 = getOptionIndex(in_XMM0_Qa,
                           (string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (HighsInt *)in_stack_ffffffffffffffc0);
  if (local_4 == kOk) {
    ppOVar1 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        (in_RDX,(long)in_stack_ffffffffffffffd4);
    HVar3 = (*ppOVar1)->type;
    if (HVar3 == kDouble) {
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                (in_RDX,(long)in_stack_ffffffffffffffd4);
      local_4 = setLocalOptionValue((HighsLogOptions *)CONCAT44(HVar3,in_stack_ffffffffffffffc8),
                                    in_stack_ffffffffffffffc0,(double)in_RDI);
    }
    else {
      uVar2 = std::__cxx11::string::c_str();
      highsLogUser(in_RDI,kError,"setLocalOptionValue: Option \"%s\" cannot be assigned a double\n",
                   uVar2);
      local_4 = kIllegalValue;
    }
  }
  return local_4;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 const std::string& name,
                                 std::vector<OptionRecord*>& option_records,
                                 const double value) {
  HighsInt index;
  //  printf("setLocalOptionValue: \"%s\" with double %g\n", name.c_str(),
  //  value);
  OptionStatus status =
      getOptionIndex(report_log_options, name, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type != HighsOptionType::kDouble) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "setLocalOptionValue: Option \"%s\" cannot be assigned a double\n",
        name.c_str());
    return OptionStatus::kIllegalValue;
  }
  return setLocalOptionValue(report_log_options,
                             ((OptionRecordDouble*)option_records[index])[0],
                             value);
}